

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

CompatibleInterfacesBase * __thiscall
cmGeneratorTarget::GetCompatibleInterfaces(cmGeneratorTarget *this,string *config)

{
  cmGeneratorTarget *pcVar1;
  CompatibleInterfacesBase *pCVar2;
  bool bVar3;
  mapped_type *pmVar4;
  reference ppcVar5;
  char *pcVar6;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  allocator local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props_3;
  string local_260;
  char *local_240;
  char *prop_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  allocator local_221;
  string local_220;
  undefined1 local_200 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props_2;
  string local_1e0;
  char *local_1c0;
  char *prop_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  allocator local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props_1;
  string local_160;
  char *local_140;
  char *prop_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  allocator local_121;
  string local_120;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string local_e0;
  char *local_c0;
  char *prop;
  __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_b0;
  const_iterator li;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  allocator local_89;
  value_type local_88;
  _Base_ptr local_68;
  undefined1 local_60;
  allocator local_41;
  value_type local_40;
  mapped_type *local_20;
  CompatibleInterfaces *compat;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  compat = (CompatibleInterfaces *)config;
  config_local = (string *)this;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces>_>_>
           ::operator[](&this->CompatibleInterfacesMap,config);
  local_20 = pmVar4;
  if ((pmVar4->Done & 1U) == 0) {
    pmVar4->Done = true;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"POSITION_INDEPENDENT_CODE",&local_41);
    pVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pmVar4,&local_40);
    local_68 = (_Base_ptr)pVar7.first._M_node;
    local_60 = pVar7.second;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pCVar2 = &local_20->super_CompatibleInterfacesBase;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"AUTOUIC_OPTIONS",&local_89);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&pCVar2->PropsString,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    li._M_current = (cmGeneratorTarget **)GetLinkImplementationClosure(this,(string *)compat);
    local_b0._M_current =
         (cmGeneratorTarget **)
         std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                   ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *
                    )li._M_current);
    while( true ) {
      prop = (char *)std::
                     vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                     end((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          *)li._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                          *)&prop);
      if (!bVar3) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_b0);
      pcVar1 = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"COMPATIBLE_INTERFACE_BOOL",
                 (allocator *)
                 ((long)&props.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar6 = GetProperty(pcVar1,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&props.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_c0 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100);
        pcVar6 = local_c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_120,pcVar6,&local_121);
        cmSystemTools::ExpandListArgument
                  (&local_120,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100,false);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        pmVar4 = local_20;
        local_130._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_100);
        prop_1 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_100);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)pmVar4,local_130,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )prop_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100);
      }
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_b0);
      pcVar1 = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_160,"COMPATIBLE_INTERFACE_STRING",
                 (allocator *)
                 ((long)&props_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar6 = GetProperty(pcVar1,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&props_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_140 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_180);
        pcVar6 = local_140;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,pcVar6,&local_1a1);
        cmSystemTools::ExpandListArgument
                  (&local_1a0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_180,false);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        pCVar2 = &local_20->super_CompatibleInterfacesBase;
        local_1b0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_180);
        prop_2 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_180);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pCVar2->PropsString,local_1b0,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )prop_2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_180);
      }
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_b0);
      pcVar1 = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e0,"COMPATIBLE_INTERFACE_NUMBER_MIN",
                 (allocator *)
                 ((long)&props_2.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar6 = GetProperty(pcVar1,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&props_2.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_1c0 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_200);
        pcVar6 = local_1c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_220,pcVar6,&local_221);
        cmSystemTools::ExpandListArgument
                  (&local_220,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_200,false);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
        pCVar2 = &local_20->super_CompatibleInterfacesBase;
        local_230._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_200);
        prop_3 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_200);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pCVar2->PropsNumberMin,local_230,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )prop_3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_200);
      }
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_b0);
      pcVar1 = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_260,"COMPATIBLE_INTERFACE_NUMBER_MAX",
                 (allocator *)
                 ((long)&props_3.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar6 = GetProperty(pcVar1,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&props_3.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_240 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_280);
        pcVar6 = local_240;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2a0,pcVar6,&local_2a1);
        cmSystemTools::ExpandListArgument
                  (&local_2a0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_280,false);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        pCVar2 = &local_20->super_CompatibleInterfacesBase;
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_280);
        __last = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_280);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pCVar2->PropsNumberMax,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_280);
      }
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&local_b0);
    }
  }
  return &local_20->super_CompatibleInterfacesBase;
}

Assistant:

const cmGeneratorTarget::CompatibleInterfacesBase&
cmGeneratorTarget::GetCompatibleInterfaces(std::string const& config) const
{
  cmGeneratorTarget::CompatibleInterfaces& compat =
    this->CompatibleInterfacesMap[config];
  if(!compat.Done)
    {
    compat.Done = true;
    compat.PropsBool.insert("POSITION_INDEPENDENT_CODE");
    compat.PropsString.insert("AUTOUIC_OPTIONS");
    std::vector<cmGeneratorTarget const*> const& deps =
      this->GetLinkImplementationClosure(config);
    for(std::vector<cmGeneratorTarget const*>::const_iterator li =
        deps.begin(); li != deps.end(); ++li)
      {
#define CM_READ_COMPATIBLE_INTERFACE(X, x) \
      if(const char* prop = (*li)->GetProperty("COMPATIBLE_INTERFACE_" #X)) \
        { \
        std::vector<std::string> props; \
        cmSystemTools::ExpandListArgument(prop, props); \
        compat.Props##x.insert(props.begin(), props.end()); \
        }
      CM_READ_COMPATIBLE_INTERFACE(BOOL, Bool)
      CM_READ_COMPATIBLE_INTERFACE(STRING, String)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MIN, NumberMin)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MAX, NumberMax)
#undef CM_READ_COMPATIBLE_INTERFACE
      }
    }
  return compat;
}